

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_nullwindow.c
# Opt level: O1

short SEARCH_nullwindow(chess_state_t *state,search_state_t *search_state,uchar depth,uchar ply,
                       move_t *move,short beta)

{
  int *piVar1;
  byte bVar2;
  move_t mVar3;
  bool bVar4;
  bool bVar5;
  pv_line_t *ppVar6;
  pv_line_t *ppVar7;
  char cVar8;
  short sVar9;
  ushort uVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  uint num_moves;
  int64_t iVar14;
  transposition_entry_t *ptVar15;
  undefined7 in_register_00000009;
  chess_state_t *moves;
  search_state_t *psVar16;
  short sVar17;
  search_state_t *psVar18;
  byte depth_00;
  uint uVar19;
  byte bVar20;
  ulong uVar21;
  ulong uVar22;
  bool bVar23;
  bool bVar24;
  bool bVar25;
  move_t next_move_1;
  bitboard_t pinned;
  bitboard_t pinners;
  bitboard_t block_check;
  move_t next_move;
  chess_state_t next_state;
  uchar local_534;
  move_t local_51c;
  ulong local_518;
  move_t (*local_510) [2];
  int (*local_508) [64] [64];
  pv_line_t *local_500;
  move_t *local_4f8;
  pv_line_t *local_4f0;
  int *local_4e8;
  bitboard_t local_4e0;
  bitboard_t local_4d8;
  bitboard_t local_4d0;
  chess_state_t local_4c8;
  chess_state_t local_438 [7];
  
  *move = 0;
  search_state->pv_table[CONCAT71(in_register_00000009,ply) & 0xffffffff].size = 0;
  iVar11 = search_state->next_clock_check;
  search_state->next_clock_check = iVar11 + -1;
  if (iVar11 < 2) {
    search_state->next_clock_check = 10000;
    iVar14 = CLOCK_time_passed(search_state->start_time_ms);
    if (search_state->time_for_move_ms <= iVar14) {
      search_state->abort_search = 1;
    }
  }
  if (search_state->abort_search != 0) {
    return 0;
  }
  bVar20 = 100;
  if (ply < 100) {
    bVar20 = ply;
  }
  iVar11 = STATE_checkers_and_pinners(state,&local_4d0,&local_4d8,&local_4e0);
  depth_00 = (depth + '\x01') - (iVar11 == 0);
  if (depth_00 == 0) {
    sVar17 = SEARCH_nullwindow_quiescence(state,search_state,beta);
    return sVar17;
  }
  uVar12 = (uint)depth_00;
  ptVar15 = HASHTABLE_transition_retrieve(search_state->hashtable,state->hash);
  if (ptVar15 != (transposition_entry_t *)0x0) {
    *move = ptVar15->best_move;
    bVar2 = ptVar15->depth;
    if (depth_00 <= bVar2) {
      sVar17 = ptVar15->score;
      if (ptVar15->type == '\x01') {
        if (beta <= sVar17) goto LAB_0010538d;
        if (sVar17 < -999) {
          sVar17 = sVar17 + ((ushort)bVar2 - (ushort)depth_00);
        }
LAB_001053ad:
        bVar25 = true;
        bVar4 = false;
      }
      else {
        if (beta <= sVar17) {
          if (999 < sVar17) {
            sVar17 = sVar17 + ((ushort)depth_00 - (ushort)bVar2);
          }
          goto LAB_001053ad;
        }
LAB_0010538d:
        bVar4 = true;
        bVar25 = false;
      }
      if (!bVar4) goto LAB_001053b8;
    }
  }
  bVar25 = false;
  sVar17 = 0;
LAB_001053b8:
  if ((!bVar25) || ((*move == 0 && (state->last_move == 0)))) {
    psVar18 = (search_state_t *)(ulong)(-uVar12 - 1000);
    if ((4 < depth_00) &&
       (((iVar11 == 0 && (state->last_move != 0)) &&
        (iVar13 = STATE_risk_zugzwang(state), iVar13 == 0)))) {
      memcpy(local_438,state,0x90);
      STATE_apply_move(local_438,0);
      sVar17 = SEARCH_nullwindow(local_438,search_state,(uVar12 == 5) + depth_00 + 0xfc,bVar20 + 1,
                                 (move_t *)&local_4c8,1 - beta);
      if (beta <= -sVar17) {
        psVar18 = (search_state_t *)(ulong)(ushort)beta;
      }
    }
    sVar17 = (short)psVar18;
    if (sVar17 < beta) {
      moves = local_438;
      num_moves = STATE_generate_moves(state,iVar11,local_4d0,local_4d8,local_4e0,(move_t *)moves);
      local_510 = search_state->killer_move + bVar20;
      MOVEORDER_rate_moves
                (state,(move_t *)moves,num_moves,*move,*local_510,
                 search_state->history_heuristic[state->player]);
      bVar4 = false;
      if ((iVar11 == 0) && (depth_00 < 4)) {
        sVar9 = EVAL_evaluate_board(state);
        bVar4 = (int)sVar9 + *(int *)(&DAT_0010b280 + (ulong)uVar12 * 4) < (int)beta;
      }
      if (0 < (int)num_moves) {
        local_508 = search_state->history_heuristic;
        local_4e8 = &search_state->pv_table[(ulong)bVar20 + 1].size;
        local_534 = depth_00 - 1;
        local_4f0 = search_state->pv_table + bVar20;
        local_4f8 = search_state->pv_table[bVar20].moves + 1;
        local_518 = (ulong)(byte)(bVar20 + 1);
        local_500 = search_state->pv_table + local_518;
        uVar22 = 0;
        uVar21 = (ulong)num_moves;
        do {
          MOVEORDER_best_move_first((move_t *)moves,(int)uVar21);
          mVar3 = (move_t)moves->bitboard[0];
          memcpy(&local_4c8,state,0x90);
          STATE_apply_move(&local_4c8,mVar3);
          uVar19 = mVar3 & 0x300000;
          if ((uVar19 != 0 || (uVar22 < 2 || !bVar4)) ||
             (iVar13 = SEARCH_is_check(&local_4c8,(uint)local_4c8.player), psVar16 = psVar18,
             iVar13 != 0)) {
            HISTORY_push(search_state->history,local_4c8.hash);
            iVar13 = HISTORY_is_repetition(search_state->history,(int)local_4c8.halfmove_clock);
            if ((iVar13 == 0) && (iVar13 = EVAL_draw(&local_4c8), iVar13 == 0)) {
              bVar23 = depth_00 < 3;
              bVar24 = uVar22 < 4;
              bVar25 = uVar19 != 0;
              bVar5 = iVar11 != 0;
              if ((bVar25 || bVar5) || (bVar24 || bVar23)) {
                cVar8 = '\0';
              }
              else {
                cVar8 = -1;
                if (0xb < uVar22 && 3 < depth_00) {
                  cVar8 = (uVar22 < 0x10 || depth_00 < 5) + -3;
                }
              }
              psVar16 = search_state;
              if ((!bVar25 && !bVar5) && (!bVar24 && !bVar23)) {
                uVar10 = SEARCH_nullwindow(&local_4c8,search_state,cVar8 + local_534,
                                           (uchar)local_518,&local_51c,1 - beta);
                psVar16 = (search_state_t *)(ulong)-(uint)uVar10;
              }
              if (((bVar25 || bVar5) || (bVar24 || bVar23)) || (short)psVar18 < (short)psVar16) {
                uVar10 = SEARCH_nullwindow(&local_4c8,search_state,local_534,(uchar)local_518,
                                           &local_51c,1 - beta);
                psVar16 = (search_state_t *)(ulong)-(uint)uVar10;
              }
            }
            else {
              *local_4e8 = 0;
              psVar16 = (search_state_t *)0x0;
            }
            HISTORY_pop(search_state->history);
          }
          ppVar7 = local_4f0;
          ppVar6 = local_500;
          if ((short)psVar18 < (short)psVar16) {
            mVar3 = (move_t)moves->bitboard[0];
            *move = mVar3;
            local_4f0->moves[0] = mVar3;
            memcpy(local_4f8,local_500,(long)local_500->size << 2);
            ppVar7->size = ppVar6->size + 1;
            if ((short)psVar16 < beta) {
              bVar25 = false;
            }
            else {
              bVar25 = true;
              if ((*move & 0x300000) == 0) {
                if (*move != (*local_510)[0]) {
                  (*local_510)[1] = (*local_510)[0];
                  (*local_510)[0] = *move;
                }
                piVar1 = (int *)((long)local_508[state->player][0] +
                                (ulong)(*move >> 4 & 0xfc) + (ulong)((*move & 0x3f) << 8));
                *piVar1 = *piVar1 + uVar12 * uVar12;
              }
            }
          }
          else {
            bVar25 = false;
            psVar16 = psVar18;
          }
          sVar17 = (short)psVar16;
          if (bVar25) break;
          uVar22 = uVar22 + 1;
          moves = (chess_state_t *)((long)moves->bitboard + 4);
          psVar18 = (search_state_t *)((ulong)psVar16 & 0xffffffff);
          bVar25 = uVar21 != 1;
          uVar21 = uVar21 - 1;
        } while (bVar25);
      }
      if (num_moves == 0 && iVar11 == 0) {
        sVar17 = 0;
      }
    }
    if (search_state->abort_search == 0) {
      HASHTABLE_transition_store
                (search_state->hashtable,state->hash,depth_00,sVar17 < beta,sVar17,*move);
    }
  }
  return sVar17;
}

Assistant:

short SEARCH_nullwindow(const chess_state_t *state, search_state_t *search_state, unsigned char depth, unsigned char ply, move_t *move, short beta)
{
    *move = 0;
    search_state->pv_table[ply].size = 0;

    /* Check if time is up */
    search_state->next_clock_check--;
    if(search_state->next_clock_check <= 0) {
        search_state->next_clock_check = SEARCH_ITERATIONS_BETWEEN_CLOCK_CHECK;
        if(CLOCK_time_passed(search_state->start_time_ms) >= search_state->time_for_move_ms) {
            search_state->abort_search = 1;
        }
    }
    if(search_state->abort_search) {
        return 0;
    }

    if(ply > MAX_SEARCH_DEPTH) ply = MAX_SEARCH_DEPTH;

    /* We will query the transition table soon, time to prefetch */
    HASHTABLE_transition_prefetch(search_state->hashtable, state->hash);

    /* Is playing side in check? */
    bitboard_t block_check, pinners, pinned;
    int num_checkers = STATE_checkers_and_pinners(state, &block_check, &pinners, &pinned);

    /* Check extension */
    if(num_checkers) {
        depth += 1;
    }

    /* Quiescence search */
    if(depth == 0) {
        return SEARCH_nullwindow_quiescence(state, search_state, beta);
    }

    /* Query the transposition table */
    int cutoff = 0;
    short ttable_score = SEARCH_transpositiontable_retrieve(search_state->hashtable, state->hash, depth, beta, move, &cutoff);
    if(cutoff) {
        if(*move || state->last_move) {
            return ttable_score;
        }
    }

    short best_score = SEARCH_MIN_RESULT(depth);

    /* Null move pruning */
    if(depth > 4 && state->last_move && !num_checkers && !STATE_risk_zugzwang(state)) {
        unsigned char R_plus_1 = ((depth > 5) ? 4 : 3);
        chess_state_t next_state = *state;
        STATE_apply_move(&next_state, 0);
        move_t next_move;
        short score = -SEARCH_nullwindow(&next_state, search_state, depth-R_plus_1, ply+1, &next_move, -beta+1);
        if(score >= beta) {
            best_score = beta;
        }
    }

    if(best_score < beta) {
        /* Generate and rate moves */
        move_t moves[256];
        int num_moves = STATE_generate_moves(state, num_checkers, block_check, pinners, pinned, moves);
        MOVEORDER_rate_moves(state, moves, num_moves, *move, search_state->killer_move[ply], search_state->history_heuristic[state->player]);

        /* Check if node is eligible for futility pruning */
        int do_futility_pruning = 0;
        if(depth <= 3 && !num_checkers) {
            const int margin[4] = { 0, 20, 25, 30 };
            if(beta > EVAL_evaluate_board(state) + margin[depth]) {
                do_futility_pruning = 1;
            }
        }

        /* Iterate over all moves */
        for(int i = 0; i < num_moves; i++) {
            /* Pick move with the highest score */
            MOVEORDER_best_move_first(&moves[i], num_moves - i);

            short score = SEARCH_move(state, search_state, depth, ply, moves[i], i, do_futility_pruning, num_checkers, best_score, beta);

            /* Check if score improved by this move */
            if(score > best_score) {
                best_score = score;
                *move = moves[i];

                search_state->pv_table[ply].moves[0] = *move;
                memcpy(&search_state->pv_table[ply].moves[1], search_state->pv_table[ply+1].moves, search_state->pv_table[ply+1].size * sizeof(move_t));
                search_state->pv_table[ply].size = 1 + search_state->pv_table[ply+1].size;

                /* Beta-cuttoff */
                if(best_score >= beta) {
                    if(!MOVE_IS_CAPTURE_OR_PROMOTION(*move)) {
                        /* Killer move */
                        if(*move != search_state->killer_move[ply][0]) {
                            search_state->killer_move[ply][1] = search_state->killer_move[ply][0];
                            search_state->killer_move[ply][0] = *move;
                        }
                        /* History heuristic */
                        search_state->history_heuristic[state->player][MOVE_GET_POS_FROM(*move)][MOVE_GET_POS_TO(*move)] += depth*depth;
                    }
                    break;
                }
            }
        }

        /* Detect checkmate and stalemate */
        if(num_moves == 0) {
            if(num_checkers) {
                /* Checkmate (worst case) */
            } else {
                /* Stalemate */
                best_score = 0;
            }
        }
    }

    /* Store the result in the transposition table */
    if(!search_state->abort_search) {
        SEARCH_transpositiontable_store(search_state->hashtable, state->hash, depth, best_score, *move, beta);
    }

    /* Return score */
    return best_score;
}